

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::ModuleUtils::(anonymous_namespace)::Counts,(wasm::
Mutability)0,wasm::InsertOrderedMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm
::Function*,wasm::ModuleUtils::(anonymous_namespace)::Counts&)>)::Mapper::Mapper(wasm::Module&,wasm
::InsertOrderedMap<wasm::Function*,wasm::ModuleUtils::(anonymous_namespace)::Counts>&,std::
function<void(wasm::Function*,wasm::ModuleUtils::(anonymous)::Counts__>_
          (void *this,Module *module,Map *map,Func *work)

{
  Func *work_local;
  Map *map_local;
  Module *module_local;
  Mapper *this_local;
  
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)this);
  *(undefined ***)this = &PTR__Mapper_0271c688;
  *(Module **)((long)this + 0x108) = module;
  *(Map **)((long)this + 0x110) = map;
  std::function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)>::
  function((function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)> *)
           ((long)this + 0x118),
           (function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)> *)
           work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}